

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O2

void polynomial_build_exp_lut
               (field_t field,field_element_t val,uint order,field_logarithm_t *val_exp)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined3 in_register_00000011;
  uint uVar4;
  
  bVar2 = field.log[1];
  bVar1 = field.log[CONCAT31(in_register_00000011,val)];
  for (uVar4 = 0; uVar4 <= order; uVar4 = uVar4 + 1) {
    if (val == '\0') {
      val_exp[uVar4] = '\0';
    }
    else {
      val_exp[uVar4] = bVar2;
      uVar3 = (ushort)bVar2 + (ushort)bVar1;
      bVar2 = ((char)uVar3 + '\x01') - (uVar3 < 0x100);
    }
  }
  return;
}

Assistant:

void polynomial_build_exp_lut(field_t field, field_element_t val, unsigned int order, field_logarithm_t *val_exp) {
    // create the lookup table of successive powers of val used by polynomial_eval_lut
    field_logarithm_t val_exponentiated = field.log[1];
    field_logarithm_t val_log = field.log[val];
    for (unsigned int i = 0; i <= order; i++) {
        if (val == 0) {
            val_exp[i] = 0;
        } else {
            val_exp[i] = val_exponentiated;
            val_exponentiated = field_mul_log(field, val_exponentiated, val_log);
        }
    }
}